

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuckoocache_tests.cpp
# Opt level: O2

double __thiscall
cuckoocache_tests::HitRateTest::test_cache<CuckooCache::cache<uint256,SignatureCacheHasher>>
          (HitRateTest *this,size_t megabytes,double load)

{
  pointer puVar1;
  bool bVar2;
  uint64_t uVar3;
  ulong __new_size;
  uint uVar4;
  long lVar5;
  uint32_t i;
  ulong uVar6;
  uint256 *h_1;
  pointer puVar7;
  uint256 *h;
  long lVar8;
  long in_FS_OFFSET;
  vector<uint256,_std::allocator<uint256>_> hashes_insert_copy;
  vector<uint256,_std::allocator<uint256>_> hashes;
  cache<uint256,_SignatureCacheHasher> set;
  _Vector_base<uint256,_std::allocator<uint256>_> local_f0;
  _Vector_base<uint256,_std::allocator<uint256>_> local_d8;
  cache<uint256,_SignatureCacheHasher> local_b8;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  BasicTestingSetup::SeedRandomForTest(&this->super_BasicTestingSetup,ZEROS);
  local_d8._M_impl.super__Vector_impl_data._M_start = (uint256 *)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_finish = (uint256 *)0x0;
  local_d8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  CuckooCache::cache<uint256,_SignatureCacheHasher>::cache(&local_b8);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::setup_bytes(&local_b8,megabytes << 0x14);
  __new_size = (long)((double)((megabytes << 0x14) >> 5) * load) & 0xffffffff;
  std::vector<uint256,_std::allocator<uint256>_>::resize
            ((vector<uint256,_std::allocator<uint256>_> *)&local_d8,__new_size);
  lVar8 = 0;
  for (uVar6 = 0; puVar7 = local_d8._M_impl.super__Vector_impl_data._M_start, uVar6 != __new_size;
      uVar6 = uVar6 + 1) {
    for (lVar5 = 0; (char)lVar5 != '\b'; lVar5 = lVar5 + 1) {
      uVar3 = RandomMixin<FastRandomContext>::randbits<32>
                        (&(this->super_BasicTestingSetup).m_rng.super_RandomMixin<FastRandomContext>
                        );
      *(int *)((puVar7->super_base_blob<256U>).m_data._M_elems + lVar5 * 4 + lVar8) = (int)uVar3;
    }
    lVar8 = lVar8 + 0x20;
  }
  std::vector<uint256,_std::allocator<uint256>_>::vector
            ((vector<uint256,_std::allocator<uint256>_> *)&local_f0,
             (vector<uint256,_std::allocator<uint256>_> *)&local_d8);
  for (puVar7 = local_f0._M_impl.super__Vector_impl_data._M_start;
      puVar1 = local_d8._M_impl.super__Vector_impl_data._M_finish,
      puVar7 != local_f0._M_impl.super__Vector_impl_data._M_finish; puVar7 = puVar7 + 1) {
    local_58 = *(undefined8 *)(puVar7->super_base_blob<256U>).m_data._M_elems;
    uStack_50 = *(undefined8 *)((puVar7->super_base_blob<256U>).m_data._M_elems + 8);
    local_48 = *(undefined8 *)((puVar7->super_base_blob<256U>).m_data._M_elems + 0x10);
    uStack_40 = *(undefined8 *)((puVar7->super_base_blob<256U>).m_data._M_elems + 0x18);
    CuckooCache::cache<uint256,_SignatureCacheHasher>::insert
              (&local_b8,
               (base_blob<256U>)*(base_blob<256U> *)(puVar7->super_base_blob<256U>).m_data._M_elems)
    ;
  }
  uVar4 = 0;
  for (puVar7 = local_d8._M_impl.super__Vector_impl_data._M_start; puVar7 != puVar1;
      puVar7 = puVar7 + 1) {
    bVar2 = CuckooCache::cache<uint256,_SignatureCacheHasher>::contains(&local_b8,puVar7,false);
    uVar4 = uVar4 + bVar2;
  }
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base(&local_f0);
  CuckooCache::cache<uint256,_SignatureCacheHasher>::~cache(&local_b8);
  std::_Vector_base<uint256,_std::allocator<uint256>_>::~_Vector_base(&local_d8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (double)uVar4 / (double)__new_size;
  }
  __stack_chk_fail();
}

Assistant:

double test_cache(size_t megabytes, double load)
{
    SeedRandomForTest(SeedRand::ZEROS);
    std::vector<uint256> hashes;
    Cache set{};
    size_t bytes = megabytes * (1 << 20);
    set.setup_bytes(bytes);
    uint32_t n_insert = static_cast<uint32_t>(load * (bytes / sizeof(uint256)));
    hashes.resize(n_insert);
    for (uint32_t i = 0; i < n_insert; ++i) {
        uint32_t* ptr = (uint32_t*)hashes[i].begin();
        for (uint8_t j = 0; j < 8; ++j)
            *(ptr++) = m_rng.rand32();
    }
    /** We make a copy of the hashes because future optimizations of the
     * cuckoocache may overwrite the inserted element, so the test is
     * "future proofed".
     */
    std::vector<uint256> hashes_insert_copy = hashes;
    /** Do the insert */
    for (const uint256& h : hashes_insert_copy)
        set.insert(h);
    /** Count the hits */
    uint32_t count = 0;
    for (const uint256& h : hashes)
        count += set.contains(h, false);
    double hit_rate = ((double)count) / ((double)n_insert);
    return hit_rate;
}